

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkinformation_p.h
# Opt level: O2

void __thiscall
QNetworkInformationBackend::setBehindCaptivePortal
          (QNetworkInformationBackend *this,bool behindPortal)

{
  long in_FS_OFFSET;
  QWriteLocker local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_20.q_val = (quintptr)(this + 0x10);
  QWriteLocker::relock(&local_20);
  if (this[0x20] != (QNetworkInformationBackend)behindPortal) {
    this[0x20] = (QNetworkInformationBackend)behindPortal;
    QWriteLocker::unlock(&local_20);
    ::QNetworkInformationBackend::behindCaptivePortalChanged(SUB81(this,0));
  }
  QWriteLocker::unlock(&local_20);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void setBehindCaptivePortal(bool behindPortal)
    {
        QWriteLocker locker(&m_lock);
        if (m_behindCaptivePortal != behindPortal) {
            m_behindCaptivePortal = behindPortal;
            locker.unlock();
            emit behindCaptivePortalChanged(behindPortal);
        }
    }